

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_metadata.cpp
# Opt level: O3

void __thiscall
duckdb::ParquetMetaDataOperatorData::LoadRowGroupMetadata
          (ParquetMetaDataOperatorData *this,ClientContext *context,
          vector<duckdb::LogicalType,_true> *return_types,OpenFileInfo *file)

{
  vector<duckdb_parquet::SchemaElement,_true> *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  pointer pCVar3;
  pointer pCVar4;
  duckdb *pdVar5;
  pointer pKVar6;
  _Alloc_hider _Var7;
  ColumnDataCollection *this_01;
  element_type *peVar8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var9;
  const_reference s_ele;
  const_reference pvVar10;
  const_reference pvVar11;
  reference schema_ele;
  InternalException *this_02;
  undefined1 uVar12;
  ulong uVar14;
  type *extraout_RDX;
  type *extraout_RDX_00;
  type *extraout_RDX_01;
  type *entry_00;
  type *entry_01;
  type *extraout_RDX_02;
  type *extraout_RDX_03;
  type *extraout_RDX_04;
  type *entry_02;
  KeyValue *entry;
  duckdb *this_03;
  pointer pKVar15;
  size_type __n;
  long lVar16;
  size_type __n_00;
  size_type __n_01;
  LogicalType *type;
  idx_t index;
  vector<duckdb::Value,_true> map_keys;
  DataChunk current_chunk;
  vector<duckdb::Value,_true> map_values;
  vector<duckdb::ParquetColumnSchema,_true> column_schemas;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  encoding_string;
  ParquetOptions parquet_options;
  ParquetReader reader;
  string local_548;
  FileMetaData *local_520;
  DataChunk local_518;
  pointer local_4d8;
  pointer pVStack_4d0;
  pointer local_4c8;
  ColumnDataCollection *local_4c0;
  size_type local_4b8;
  size_type local_4b0;
  ParquetColumnSchema local_4a8;
  vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_> local_418;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_3f8;
  size_type local_3f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_3d8;
  ParquetMetaDataOperatorData *local_3b8;
  vector<duckdb_parquet::RowGroup,_true> *local_3b0;
  OpenFileInfo *local_3a8;
  vector<duckdb_parquet::ColumnChunk,_true> *local_3a0;
  string local_398;
  vector<duckdb::Value,_true> local_378;
  vector<duckdb::Value,_true> local_358;
  shared_ptr<duckdb::ParquetFileMetadataCache,_true> local_338;
  OpenFileInfo local_328;
  LogicalType local_2f8;
  string local_2e0;
  string local_2c0;
  string local_2a0;
  string local_280;
  ParquetOptions local_260;
  ParquetOptions local_220;
  LogicalType local_1e0;
  ParquetReader local_1c8;
  Value *pVVar13;
  
  local_4c0 = &this->collection;
  ColumnDataCollection::Reset(local_4c0);
  ParquetOptions::ParquetOptions(&local_260,context);
  pcVar2 = (file->path)._M_dataplus._M_p;
  local_3f8 = &local_3e8;
  local_3a8 = file;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_3f8,pcVar2,pcVar2 + (file->path)._M_string_length);
  paVar1 = &local_328.path.field_2;
  if (local_3f8 == &local_3e8) {
    local_328.path.field_2._8_8_ = local_3e8._8_8_;
    local_328.path._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_328.path._M_dataplus._M_p = (pointer)local_3f8;
  }
  local_328.path._M_string_length = local_3f0;
  local_3f0 = 0;
  local_3e8._M_local_buf[0] = '\0';
  local_328.extended_info.internal.
  super___shared_ptr<duckdb::ExtendedOpenFileInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_328.extended_info.internal.
  super___shared_ptr<duckdb::ExtendedOpenFileInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_220.binary_as_string = local_260.binary_as_string;
  local_220.file_row_number = local_260.file_row_number;
  local_220.encryption_config.internal.
  super___shared_ptr<duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_260.encryption_config.internal.
       super___shared_ptr<duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_220.encryption_config.internal.
  super___shared_ptr<duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = local_260.encryption_config.internal.
         super___shared_ptr<duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>._M_refcount
         ._M_pi;
  if (local_260.encryption_config.internal.
      super___shared_ptr<duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_260.encryption_config.internal.
       super___shared_ptr<duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_260.encryption_config.internal.
            super___shared_ptr<duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_260.encryption_config.internal.
       super___shared_ptr<duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_260.encryption_config.internal.
            super___shared_ptr<duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  local_220.debug_use_openssl = local_260.debug_use_openssl;
  local_3f8 = &local_3e8;
  local_3b8 = this;
  ::std::vector<duckdb::ParquetColumnDefinition,_std::allocator<duckdb::ParquetColumnDefinition>_>::
  vector(&local_220.schema.
          super_vector<duckdb::ParquetColumnDefinition,_std::allocator<duckdb::ParquetColumnDefinition>_>
         ,&local_260.schema.
           super_vector<duckdb::ParquetColumnDefinition,_std::allocator<duckdb::ParquetColumnDefinition>_>
        );
  local_220.explicit_cardinality = local_260.explicit_cardinality;
  local_338.internal.
  super___shared_ptr<duckdb::ParquetFileMetadataCache,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_338.internal.
  super___shared_ptr<duckdb::ParquetFileMetadataCache,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  ParquetReader::ParquetReader(&local_1c8,context,&local_328,&local_220,&local_338);
  if (local_338.internal.
      super___shared_ptr<duckdb::ParquetFileMetadataCache,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_338.internal.
               super___shared_ptr<duckdb::ParquetFileMetadataCache,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  ::std::vector<duckdb::ParquetColumnDefinition,_std::allocator<duckdb::ParquetColumnDefinition>_>::
  ~vector(&local_220.schema.
           super_vector<duckdb::ParquetColumnDefinition,_std::allocator<duckdb::ParquetColumnDefinition>_>
         );
  if (local_220.encryption_config.internal.
      super___shared_ptr<duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_220.encryption_config.internal.
               super___shared_ptr<duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_328.extended_info.internal.
      super___shared_ptr<duckdb::ExtendedOpenFileInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_328.extended_info.internal.
               super___shared_ptr<duckdb::ExtendedOpenFileInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_328.path._M_dataplus._M_p != paVar1) {
    operator_delete(local_328.path._M_dataplus._M_p);
  }
  if (local_3f8 != &local_3e8) {
    operator_delete(local_3f8);
  }
  DataChunk::DataChunk(&local_518);
  DataChunk::Initialize(&local_518,context,return_types,0x800);
  local_520 = ParquetReader::GetFileMetadata(&local_1c8);
  local_418.
  super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_418.
  super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_418.
  super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((local_520->schema).
      super_vector<duckdb_parquet::SchemaElement,_std::allocator<duckdb_parquet::SchemaElement>_>.
      super__Vector_base<duckdb_parquet::SchemaElement,_std::allocator<duckdb_parquet::SchemaElement>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (local_520->schema).
      super_vector<duckdb_parquet::SchemaElement,_std::allocator<duckdb_parquet::SchemaElement>_>.
      super__Vector_base<duckdb_parquet::SchemaElement,_std::allocator<duckdb_parquet::SchemaElement>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    this_00 = &local_520->schema;
    __n_01 = 0;
    do {
      s_ele = vector<duckdb_parquet::SchemaElement,_true>::operator[](this_00,__n_01);
      if (s_ele->num_children < 1) {
        ParquetColumnSchema::ParquetColumnSchema(&local_4a8);
        ParquetReader::DeriveLogicalType((LogicalType *)&local_548,&local_1c8,s_ele,&local_4a8);
        _Var9._M_pi = local_4a8.type.type_info_.internal.
                      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi;
        peVar8 = local_4a8.type.type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        _Var7._M_p = local_548._M_dataplus._M_p;
        local_4a8.type.id_ = (LogicalTypeId)local_548._M_dataplus._M_p;
        local_4a8.type.physical_type_ = local_548._M_dataplus._M_p._1_1_;
        local_4a8.type.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)local_548._M_string_length;
        local_4a8.type.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_548.field_2._M_allocated_capacity
        ;
        local_548._M_string_length = (size_type)peVar8;
        local_548.field_2._M_allocated_capacity = (size_type)_Var9._M_pi;
        local_548._M_dataplus._M_p = _Var7._M_p;
        LogicalType::~LogicalType((LogicalType *)&local_548);
        ::std::vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>::
        emplace_back<duckdb::ParquetColumnSchema>(&local_418,&local_4a8);
        ::std::vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>::
        ~vector(&local_4a8.children.
                 super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
               );
        LogicalType::~LogicalType(&local_4a8.type);
        if (local_4a8.name._M_dataplus._M_p != (pointer)((long)&local_4a8 + 0x18U)) {
          operator_delete(local_4a8.name._M_dataplus._M_p);
        }
      }
      __n_01 = __n_01 + 1;
    } while (__n_01 < (ulong)(((long)(local_520->schema).
                                     super_vector<duckdb_parquet::SchemaElement,_std::allocator<duckdb_parquet::SchemaElement>_>
                                     .
                                     super__Vector_base<duckdb_parquet::SchemaElement,_std::allocator<duckdb_parquet::SchemaElement>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(local_520->schema).
                                     super_vector<duckdb_parquet::SchemaElement,_std::allocator<duckdb_parquet::SchemaElement>_>
                                     .
                                     super__Vector_base<duckdb_parquet::SchemaElement,_std::allocator<duckdb_parquet::SchemaElement>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3) *
                             -0x7063e7063e7063e7));
  }
  if ((local_520->row_groups).
      super_vector<duckdb_parquet::RowGroup,_std::allocator<duckdb_parquet::RowGroup>_>.
      super__Vector_base<duckdb_parquet::RowGroup,_std::allocator<duckdb_parquet::RowGroup>_>.
      _M_impl.super__Vector_impl_data._M_finish ==
      (local_520->row_groups).
      super_vector<duckdb_parquet::RowGroup,_std::allocator<duckdb_parquet::RowGroup>_>.
      super__Vector_base<duckdb_parquet::RowGroup,_std::allocator<duckdb_parquet::RowGroup>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    index = 0;
  }
  else {
    local_3b0 = &local_520->row_groups;
    index = 0;
    __n_00 = 0;
    do {
      local_4b8 = __n_00;
      pvVar10 = vector<duckdb_parquet::RowGroup,_true>::operator[](local_3b0,__n_00);
      pCVar3 = (pvVar10->columns).
               super_vector<duckdb_parquet::ColumnChunk,_std::allocator<duckdb_parquet::ColumnChunk>_>
               .
               super__Vector_base<duckdb_parquet::ColumnChunk,_std::allocator<duckdb_parquet::ColumnChunk>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pCVar4 = (pvVar10->columns).
               super_vector<duckdb_parquet::ColumnChunk,_std::allocator<duckdb_parquet::ColumnChunk>_>
               .
               super__Vector_base<duckdb_parquet::ColumnChunk,_std::allocator<duckdb_parquet::ColumnChunk>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      uVar14 = ((long)pCVar4 - (long)pCVar3 >> 7) * -0x3333333333333333;
      lVar16 = (long)local_418.
                     super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_418.
                     super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 4;
      if ((ulong)(lVar16 * -0x71c71c71c71c71c7) <= uVar14 &&
          uVar14 + lVar16 * 0x71c71c71c71c71c7 != 0) {
        this_02 = (InternalException *)__cxa_allocate_exception(0x10);
        local_4a8._0_8_ = (long)&local_4a8 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_4a8,"Too many column in row group: corrupt file?","");
        InternalException::InternalException(this_02,(string *)&local_4a8);
        __cxa_throw(this_02,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
      if (pCVar4 != pCVar3) {
        local_3a0 = &pvVar10->columns;
        __n = 0;
        do {
          pvVar11 = vector<duckdb_parquet::ColumnChunk,_true>::operator[](local_3a0,__n);
          local_4b0 = __n;
          schema_ele = vector<duckdb::ParquetColumnSchema,_true>::operator[]
                                 ((vector<duckdb::ParquetColumnSchema,_true> *)&local_418,__n);
          pcVar2 = (local_3a8->path)._M_dataplus._M_p;
          local_398._M_dataplus._M_p = (pointer)&local_398.field_2;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_398,pcVar2,pcVar2 + (local_3a8->path)._M_string_length);
          Value::Value((Value *)&local_4a8,&local_398);
          DataChunk::SetValue(&local_518,0,index,(Value *)&local_4a8);
          Value::~Value((Value *)&local_4a8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_398._M_dataplus._M_p != &local_398.field_2) {
            operator_delete(local_398._M_dataplus._M_p);
          }
          Value::BIGINT((Value *)&local_4a8,local_4b8);
          DataChunk::SetValue(&local_518,1,index,(Value *)&local_4a8);
          Value::~Value((Value *)&local_4a8);
          Value::BIGINT((Value *)&local_4a8,pvVar10->num_rows);
          DataChunk::SetValue(&local_518,2,index,(Value *)&local_4a8);
          Value::~Value((Value *)&local_4a8);
          Value::BIGINT((Value *)&local_4a8,
                        ((long)(pvVar10->columns).
                               super_vector<duckdb_parquet::ColumnChunk,_std::allocator<duckdb_parquet::ColumnChunk>_>
                               .
                               super__Vector_base<duckdb_parquet::ColumnChunk,_std::allocator<duckdb_parquet::ColumnChunk>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(pvVar10->columns).
                               super_vector<duckdb_parquet::ColumnChunk,_std::allocator<duckdb_parquet::ColumnChunk>_>
                               .
                               super__Vector_base<duckdb_parquet::ColumnChunk,_std::allocator<duckdb_parquet::ColumnChunk>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 7) * -0x3333333333333333
                       );
          DataChunk::SetValue(&local_518,3,index,(Value *)&local_4a8);
          Value::~Value((Value *)&local_4a8);
          Value::BIGINT((Value *)&local_4a8,pvVar10->total_byte_size);
          DataChunk::SetValue(&local_518,4,index,(Value *)&local_4a8);
          Value::~Value((Value *)&local_4a8);
          Value::BIGINT((Value *)&local_4a8,local_4b0);
          pVVar13 = (Value *)&local_4a8;
          DataChunk::SetValue(&local_518,5,index,(Value *)&local_4a8);
          uVar12 = SUB81(pVVar13,0);
          Value::~Value((Value *)&local_4a8);
          ParquetElementBigint<long_const&>
                    ((Value *)&local_4a8,(duckdb *)&pvVar11->file_offset,
                     (long *)(ulong)(((byte)pvVar10->__isset & 2) >> 1),(bool)uVar12);
          DataChunk::SetValue(&local_518,6,index,(Value *)&local_4a8);
          Value::~Value((Value *)&local_4a8);
          Value::BIGINT((Value *)&local_4a8,(pvVar11->meta_data).num_values);
          DataChunk::SetValue(&local_518,7,index,(Value *)&local_4a8);
          Value::~Value((Value *)&local_4a8);
          local_548._M_dataplus._M_p = (pointer)&local_548.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_548,", ","");
          StringUtil::Join(&local_280,&(pvVar11->meta_data).path_in_schema,&local_548);
          Value::Value((Value *)&local_4a8,&local_280);
          DataChunk::SetValue(&local_518,8,index,(Value *)&local_4a8);
          Value::~Value((Value *)&local_4a8);
          entry_00 = extraout_RDX;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_280._M_dataplus._M_p != &local_280.field_2) {
            operator_delete(local_280._M_dataplus._M_p);
            entry_00 = extraout_RDX_00;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_548._M_dataplus._M_p != &local_548.field_2) {
            operator_delete(local_548._M_dataplus._M_p);
            entry_00 = extraout_RDX_01;
          }
          ConvertParquetElementToString<duckdb_parquet::Type::type_const&>
                    (&local_2a0,(duckdb *)&(pvVar11->meta_data).type,entry_00);
          Value::Value((Value *)&local_4a8,&local_2a0);
          DataChunk::SetValue(&local_518,9,index,(Value *)&local_4a8);
          Value::~Value((Value *)&local_4a8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
            operator_delete(local_2a0._M_dataplus._M_p);
          }
          type = &schema_ele->type;
          ConvertParquetStats((Value *)&local_4a8,type,schema_ele,
                              (bool)(((byte)(pvVar11->meta_data).statistics.__isset & 2) >> 1),
                              &(pvVar11->meta_data).statistics.min);
          DataChunk::SetValue(&local_518,10,index,(Value *)&local_4a8);
          Value::~Value((Value *)&local_4a8);
          ConvertParquetStats((Value *)&local_4a8,type,schema_ele,
                              (bool)((byte)(pvVar11->meta_data).statistics.__isset & 1),
                              &(pvVar11->meta_data).statistics.max);
          pVVar13 = (Value *)&local_4a8;
          DataChunk::SetValue(&local_518,0xb,index,(Value *)&local_4a8);
          uVar12 = SUB81(pVVar13,0);
          Value::~Value((Value *)&local_4a8);
          ParquetElementBigint<long_const&>
                    ((Value *)&local_4a8,(duckdb *)&(pvVar11->meta_data).statistics.null_count,
                     (long *)(ulong)(((byte)(pvVar11->meta_data).statistics.__isset & 4) >> 2),
                     (bool)uVar12);
          pVVar13 = (Value *)&local_4a8;
          DataChunk::SetValue(&local_518,0xc,index,(Value *)&local_4a8);
          uVar12 = SUB81(pVVar13,0);
          Value::~Value((Value *)&local_4a8);
          ParquetElementBigint<long_const&>
                    ((Value *)&local_4a8,(duckdb *)&(pvVar11->meta_data).statistics.distinct_count,
                     (long *)(ulong)(((byte)(pvVar11->meta_data).statistics.__isset & 8) >> 3),
                     (bool)uVar12);
          DataChunk::SetValue(&local_518,0xd,index,(Value *)&local_4a8);
          Value::~Value((Value *)&local_4a8);
          ConvertParquetStats((Value *)&local_4a8,type,schema_ele,
                              (bool)(((byte)(pvVar11->meta_data).statistics.__isset & 0x20) >> 5),
                              &(pvVar11->meta_data).statistics.min_value);
          DataChunk::SetValue(&local_518,0xe,index,(Value *)&local_4a8);
          Value::~Value((Value *)&local_4a8);
          ConvertParquetStats((Value *)&local_4a8,type,schema_ele,
                              (bool)(((byte)(pvVar11->meta_data).statistics.__isset & 0x10) >> 4),
                              &(pvVar11->meta_data).statistics.max_value);
          DataChunk::SetValue(&local_518,0xf,index,(Value *)&local_4a8);
          Value::~Value((Value *)&local_4a8);
          ConvertParquetElementToString<duckdb_parquet::CompressionCodec::type_const&>
                    (&local_2c0,(duckdb *)&(pvVar11->meta_data).codec,entry_01);
          Value::Value((Value *)&local_4a8,&local_2c0);
          DataChunk::SetValue(&local_518,0x10,index,(Value *)&local_4a8);
          Value::~Value((Value *)&local_4a8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
            operator_delete(local_2c0._M_dataplus._M_p);
          }
          local_3d8.
          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_3d8.
          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_3d8.
          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          ::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::reserve((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_3d8,
                    (long)(pvVar11->meta_data).encodings.
                          super_vector<duckdb_parquet::Encoding::type,_std::allocator<duckdb_parquet::Encoding::type>_>
                          .
                          super__Vector_base<duckdb_parquet::Encoding::type,_std::allocator<duckdb_parquet::Encoding::type>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(pvVar11->meta_data).encodings.
                          super_vector<duckdb_parquet::Encoding::type,_std::allocator<duckdb_parquet::Encoding::type>_>
                          .
                          super__Vector_base<duckdb_parquet::Encoding::type,_std::allocator<duckdb_parquet::Encoding::type>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 2);
          pdVar5 = (duckdb *)
                   (pvVar11->meta_data).encodings.
                   super_vector<duckdb_parquet::Encoding::type,_std::allocator<duckdb_parquet::Encoding::type>_>
                   .
                   super__Vector_base<duckdb_parquet::Encoding::type,_std::allocator<duckdb_parquet::Encoding::type>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          entry_02 = extraout_RDX_02;
          for (this_03 = (duckdb *)
                         (pvVar11->meta_data).encodings.
                         super_vector<duckdb_parquet::Encoding::type,_std::allocator<duckdb_parquet::Encoding::type>_>
                         .
                         super__Vector_base<duckdb_parquet::Encoding::type,_std::allocator<duckdb_parquet::Encoding::type>_>
                         ._M_impl.super__Vector_impl_data._M_start; this_03 != pdVar5;
              this_03 = this_03 + 4) {
            ConvertParquetElementToString<duckdb_parquet::Encoding::type_const&>
                      ((string *)&local_4a8,this_03,entry_02);
            ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &local_3d8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_4a8);
            entry_02 = extraout_RDX_03;
            if ((pointer)local_4a8._0_8_ != (pointer)((long)&local_4a8 + 0x10U)) {
              operator_delete((void *)local_4a8._0_8_);
              entry_02 = extraout_RDX_04;
            }
          }
          local_548._M_dataplus._M_p = (pointer)&local_548.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_548,", ","");
          StringUtil::Join(&local_2e0,&local_3d8,&local_548);
          Value::Value((Value *)&local_4a8,&local_2e0);
          pVVar13 = (Value *)&local_4a8;
          DataChunk::SetValue(&local_518,0x11,index,(Value *)&local_4a8);
          uVar12 = SUB81(pVVar13,0);
          Value::~Value((Value *)&local_4a8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
            operator_delete(local_2e0._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_548._M_dataplus._M_p != &local_548.field_2) {
            operator_delete(local_548._M_dataplus._M_p);
          }
          ParquetElementBigint<long_const&>
                    ((Value *)&local_4a8,(duckdb *)&(pvVar11->meta_data).index_page_offset,
                     (long *)(ulong)(((byte)(pvVar11->meta_data).__isset & 2) >> 1),(bool)uVar12);
          pVVar13 = (Value *)&local_4a8;
          DataChunk::SetValue(&local_518,0x12,index,(Value *)&local_4a8);
          uVar12 = SUB81(pVVar13,0);
          Value::~Value((Value *)&local_4a8);
          ParquetElementBigint<long_const&>
                    ((Value *)&local_4a8,(duckdb *)&(pvVar11->meta_data).dictionary_page_offset,
                     (long *)(ulong)(((byte)(pvVar11->meta_data).__isset & 4) >> 2),(bool)uVar12);
          DataChunk::SetValue(&local_518,0x13,index,(Value *)&local_4a8);
          Value::~Value((Value *)&local_4a8);
          Value::BIGINT((Value *)&local_4a8,(pvVar11->meta_data).data_page_offset);
          DataChunk::SetValue(&local_518,0x14,index,(Value *)&local_4a8);
          Value::~Value((Value *)&local_4a8);
          Value::BIGINT((Value *)&local_4a8,(pvVar11->meta_data).total_compressed_size);
          DataChunk::SetValue(&local_518,0x15,index,(Value *)&local_4a8);
          Value::~Value((Value *)&local_4a8);
          Value::BIGINT((Value *)&local_4a8,(pvVar11->meta_data).total_uncompressed_size);
          DataChunk::SetValue(&local_518,0x16,index,(Value *)&local_4a8);
          Value::~Value((Value *)&local_4a8);
          local_548.field_2._M_allocated_capacity = 0;
          local_548._M_dataplus._M_p = (pointer)0x0;
          local_548._M_string_length = 0;
          local_4c8 = (pointer)0x0;
          local_4d8 = (pointer)0x0;
          pVStack_4d0 = (pointer)0x0;
          pKVar6 = (pvVar11->meta_data).key_value_metadata.
                   super_vector<duckdb_parquet::KeyValue,_std::allocator<duckdb_parquet::KeyValue>_>
                   .
                   super__Vector_base<duckdb_parquet::KeyValue,_std::allocator<duckdb_parquet::KeyValue>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          for (pKVar15 = (pvVar11->meta_data).key_value_metadata.
                         super_vector<duckdb_parquet::KeyValue,_std::allocator<duckdb_parquet::KeyValue>_>
                         .
                         super__Vector_base<duckdb_parquet::KeyValue,_std::allocator<duckdb_parquet::KeyValue>_>
                         ._M_impl.super__Vector_impl_data._M_start; pKVar15 != pKVar6;
              pKVar15 = pKVar15 + 1) {
            Value::BLOB((Value *)&local_4a8,(const_data_ptr_t)(pKVar15->key)._M_dataplus._M_p,
                        (pKVar15->key)._M_string_length);
            ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::
            emplace_back<duckdb::Value>
                      ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_548,
                       (Value *)&local_4a8);
            Value::~Value((Value *)&local_4a8);
            Value::BLOB((Value *)&local_4a8,(const_data_ptr_t)(pKVar15->value)._M_dataplus._M_p,
                        (pKVar15->value)._M_string_length);
            ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::
            emplace_back<duckdb::Value>
                      ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_4d8,
                       (Value *)&local_4a8);
            Value::~Value((Value *)&local_4a8);
          }
          LogicalType::LogicalType(&local_2f8,BLOB);
          LogicalType::LogicalType(&local_1e0,BLOB);
          local_358.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
          super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)local_548._M_dataplus._M_p;
          local_358.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
          super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)local_548._M_string_length;
          local_358.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
          super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               (pointer)local_548.field_2._M_allocated_capacity;
          local_548._M_dataplus._M_p = (pointer)0x0;
          local_548._M_string_length = 0;
          local_548.field_2._M_allocated_capacity = 0;
          local_378.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
          super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
          super__Vector_impl_data._M_start = local_4d8;
          local_378.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
          super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
          super__Vector_impl_data._M_finish = pVStack_4d0;
          local_378.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
          super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = local_4c8;
          local_4d8 = (pointer)0x0;
          pVStack_4d0 = (pointer)0x0;
          local_4c8 = (pointer)0x0;
          Value::MAP((Value *)&local_4a8,&local_2f8,&local_1e0,&local_358,&local_378);
          pVVar13 = (Value *)&local_4a8;
          DataChunk::SetValue(&local_518,0x17,index,(Value *)&local_4a8);
          uVar12 = SUB81(pVVar13,0);
          Value::~Value((Value *)&local_4a8);
          ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
                    ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_378);
          ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
                    ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_358);
          LogicalType::~LogicalType(&local_1e0);
          LogicalType::~LogicalType(&local_2f8);
          ParquetElementBigint<long_const&>
                    ((Value *)&local_4a8,(duckdb *)&(pvVar11->meta_data).bloom_filter_offset,
                     (long *)(ulong)(((byte)(pvVar11->meta_data).__isset & 0x20) >> 5),(bool)uVar12)
          ;
          pVVar13 = (Value *)&local_4a8;
          DataChunk::SetValue(&local_518,0x18,index,(Value *)&local_4a8);
          uVar12 = SUB81(pVVar13,0);
          Value::~Value((Value *)&local_4a8);
          ParquetElementBigint<int_const&>
                    ((Value *)&local_4a8,(duckdb *)&(pvVar11->meta_data).bloom_filter_length,
                     (int *)(ulong)(((byte)(pvVar11->meta_data).__isset & 0x40) >> 6),(bool)uVar12);
          DataChunk::SetValue(&local_518,0x19,index,(Value *)&local_4a8);
          Value::~Value((Value *)&local_4a8);
          ParquetElementBoolean
                    ((Value *)&local_4a8,(pvVar11->meta_data).statistics.is_min_value_exact,
                     (bool)((byte)(pvVar11->meta_data).statistics.__isset >> 7));
          DataChunk::SetValue(&local_518,0x1a,index,(Value *)&local_4a8);
          Value::~Value((Value *)&local_4a8);
          ParquetElementBoolean
                    ((Value *)&local_4a8,(pvVar11->meta_data).statistics.is_max_value_exact,
                     (bool)(((byte)(pvVar11->meta_data).statistics.__isset & 0x40) >> 6));
          DataChunk::SetValue(&local_518,0x1b,index,(Value *)&local_4a8);
          Value::~Value((Value *)&local_4a8);
          index = index + 1;
          if (0x7ff < index) {
            local_518.count = index;
            ColumnDataCollection::Append(local_4c0,&local_518);
            DataChunk::Reset(&local_518);
            index = 0;
          }
          ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
                    ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_4d8);
          ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
                    ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_548);
          ::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_3d8);
          __n = local_4b0 + 1;
        } while (__n < (ulong)(((long)(pvVar10->columns).
                                      super_vector<duckdb_parquet::ColumnChunk,_std::allocator<duckdb_parquet::ColumnChunk>_>
                                      .
                                      super__Vector_base<duckdb_parquet::ColumnChunk,_std::allocator<duckdb_parquet::ColumnChunk>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(pvVar10->columns).
                                      super_vector<duckdb_parquet::ColumnChunk,_std::allocator<duckdb_parquet::ColumnChunk>_>
                                      .
                                      super__Vector_base<duckdb_parquet::ColumnChunk,_std::allocator<duckdb_parquet::ColumnChunk>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 7) *
                              -0x3333333333333333));
      }
      __n_00 = local_4b8 + 1;
    } while (__n_00 < (ulong)(((long)(local_520->row_groups).
                                     super_vector<duckdb_parquet::RowGroup,_std::allocator<duckdb_parquet::RowGroup>_>
                                     .
                                     super__Vector_base<duckdb_parquet::RowGroup,_std::allocator<duckdb_parquet::RowGroup>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(local_520->row_groups).
                                     super_vector<duckdb_parquet::RowGroup,_std::allocator<duckdb_parquet::RowGroup>_>
                                     .
                                     super__Vector_base<duckdb_parquet::RowGroup,_std::allocator<duckdb_parquet::RowGroup>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 5) *
                             -0x5555555555555555));
  }
  this_01 = local_4c0;
  local_518.count = index;
  ColumnDataCollection::Append(local_4c0,&local_518);
  ColumnDataCollection::InitializeScan(this_01,&local_3b8->scan_state,ALLOW_ZERO_COPY);
  ::std::vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>::~vector
            (&local_418);
  DataChunk::~DataChunk(&local_518);
  ParquetReader::~ParquetReader(&local_1c8);
  ::std::vector<duckdb::ParquetColumnDefinition,_std::allocator<duckdb::ParquetColumnDefinition>_>::
  ~vector(&local_260.schema.
           super_vector<duckdb::ParquetColumnDefinition,_std::allocator<duckdb::ParquetColumnDefinition>_>
         );
  if (local_260.encryption_config.internal.
      super___shared_ptr<duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_260.encryption_config.internal.
               super___shared_ptr<duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return;
}

Assistant:

void ParquetMetaDataOperatorData::LoadRowGroupMetadata(ClientContext &context, const vector<LogicalType> &return_types,
                                                       const OpenFileInfo &file) {
	collection.Reset();
	ParquetOptions parquet_options(context);
	ParquetReader reader(context, file.path, parquet_options);
	idx_t count = 0;
	DataChunk current_chunk;
	current_chunk.Initialize(context, return_types);
	auto meta_data = reader.GetFileMetadata();
	vector<ParquetColumnSchema> column_schemas;
	for (idx_t schema_idx = 0; schema_idx < meta_data->schema.size(); schema_idx++) {
		auto &schema_element = meta_data->schema[schema_idx];
		if (schema_element.num_children > 0) {
			continue;
		}
		ParquetColumnSchema column_schema;
		column_schema.type = reader.DeriveLogicalType(schema_element, column_schema);
		column_schemas.push_back(std::move(column_schema));
	}

	for (idx_t row_group_idx = 0; row_group_idx < meta_data->row_groups.size(); row_group_idx++) {
		auto &row_group = meta_data->row_groups[row_group_idx];

		if (row_group.columns.size() > column_schemas.size()) {
			throw InternalException("Too many column in row group: corrupt file?");
		}
		for (idx_t col_idx = 0; col_idx < row_group.columns.size(); col_idx++) {
			auto &column = row_group.columns[col_idx];
			auto &column_schema = column_schemas[col_idx];
			auto &col_meta = column.meta_data;
			auto &stats = col_meta.statistics;
			auto &column_type = column_schema.type;

			// file_name, LogicalType::VARCHAR
			current_chunk.SetValue(0, count, file.path);

			// row_group_id, LogicalType::BIGINT
			current_chunk.SetValue(1, count, Value::BIGINT(UnsafeNumericCast<int64_t>(row_group_idx)));

			// row_group_num_rows, LogicalType::BIGINT
			current_chunk.SetValue(2, count, Value::BIGINT(row_group.num_rows));

			// row_group_num_columns, LogicalType::BIGINT
			current_chunk.SetValue(3, count, Value::BIGINT(UnsafeNumericCast<int64_t>(row_group.columns.size())));

			// row_group_bytes, LogicalType::BIGINT
			current_chunk.SetValue(4, count, Value::BIGINT(row_group.total_byte_size));

			// column_id, LogicalType::BIGINT
			current_chunk.SetValue(5, count, Value::BIGINT(UnsafeNumericCast<int64_t>(col_idx)));

			// file_offset, LogicalType::BIGINT
			current_chunk.SetValue(6, count, ParquetElementBigint(column.file_offset, row_group.__isset.file_offset));

			// num_values, LogicalType::BIGINT
			current_chunk.SetValue(7, count, Value::BIGINT(col_meta.num_values));

			// path_in_schema, LogicalType::VARCHAR
			current_chunk.SetValue(8, count, StringUtil::Join(col_meta.path_in_schema, ", "));

			// type, LogicalType::VARCHAR
			current_chunk.SetValue(9, count, ConvertParquetElementToString(col_meta.type));

			// stats_min, LogicalType::VARCHAR
			current_chunk.SetValue(10, count,
			                       ConvertParquetStats(column_type, column_schema, stats.__isset.min, stats.min));

			// stats_max, LogicalType::VARCHAR
			current_chunk.SetValue(11, count,
			                       ConvertParquetStats(column_type, column_schema, stats.__isset.max, stats.max));

			// stats_null_count, LogicalType::BIGINT
			current_chunk.SetValue(12, count, ParquetElementBigint(stats.null_count, stats.__isset.null_count));

			// stats_distinct_count, LogicalType::BIGINT
			current_chunk.SetValue(13, count, ParquetElementBigint(stats.distinct_count, stats.__isset.distinct_count));

			// stats_min_value, LogicalType::VARCHAR
			current_chunk.SetValue(
			    14, count, ConvertParquetStats(column_type, column_schema, stats.__isset.min_value, stats.min_value));

			// stats_max_value, LogicalType::VARCHAR
			current_chunk.SetValue(
			    15, count, ConvertParquetStats(column_type, column_schema, stats.__isset.max_value, stats.max_value));

			// compression, LogicalType::VARCHAR
			current_chunk.SetValue(16, count, ConvertParquetElementToString(col_meta.codec));

			// encodings, LogicalType::VARCHAR
			vector<string> encoding_string;
			encoding_string.reserve(col_meta.encodings.size());
			for (auto &encoding : col_meta.encodings) {
				encoding_string.push_back(ConvertParquetElementToString(encoding));
			}
			current_chunk.SetValue(17, count, Value(StringUtil::Join(encoding_string, ", ")));

			// index_page_offset, LogicalType::BIGINT
			current_chunk.SetValue(
			    18, count, ParquetElementBigint(col_meta.index_page_offset, col_meta.__isset.index_page_offset));

			// dictionary_page_offset, LogicalType::BIGINT
			current_chunk.SetValue(
			    19, count,
			    ParquetElementBigint(col_meta.dictionary_page_offset, col_meta.__isset.dictionary_page_offset));

			// data_page_offset, LogicalType::BIGINT
			current_chunk.SetValue(20, count, Value::BIGINT(col_meta.data_page_offset));

			// total_compressed_size, LogicalType::BIGINT
			current_chunk.SetValue(21, count, Value::BIGINT(col_meta.total_compressed_size));

			// total_uncompressed_size, LogicalType::BIGINT
			current_chunk.SetValue(22, count, Value::BIGINT(col_meta.total_uncompressed_size));

			// key_value_metadata, LogicalType::MAP(LogicalType::BLOB, LogicalType::BLOB)
			vector<Value> map_keys, map_values;
			for (auto &entry : col_meta.key_value_metadata) {
				map_keys.push_back(Value::BLOB_RAW(entry.key));
				map_values.push_back(Value::BLOB_RAW(entry.value));
			}
			current_chunk.SetValue(
			    23, count,
			    Value::MAP(LogicalType::BLOB, LogicalType::BLOB, std::move(map_keys), std::move(map_values)));

			// bloom_filter_offset, LogicalType::BIGINT
			current_chunk.SetValue(
			    24, count, ParquetElementBigint(col_meta.bloom_filter_offset, col_meta.__isset.bloom_filter_offset));

			// bloom_filter_length, LogicalType::BIGINT
			current_chunk.SetValue(
			    25, count, ParquetElementBigint(col_meta.bloom_filter_length, col_meta.__isset.bloom_filter_length));

			// min_is_exact, LogicalType::BOOLEAN
			current_chunk.SetValue(26, count,
			                       ParquetElementBoolean(stats.is_min_value_exact, stats.__isset.is_min_value_exact));

			// max_is_exact, LogicalType::BOOLEAN
			current_chunk.SetValue(27, count,
			                       ParquetElementBoolean(stats.is_max_value_exact, stats.__isset.is_max_value_exact));

			count++;
			if (count >= STANDARD_VECTOR_SIZE) {
				current_chunk.SetCardinality(count);
				collection.Append(current_chunk);

				count = 0;
				current_chunk.Reset();
			}
		}
	}
	current_chunk.SetCardinality(count);
	collection.Append(current_chunk);

	collection.InitializeScan(scan_state);
}